

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

Template * __thiscall
inja::Environment::parse_template
          (Template *__return_storage_ptr__,Environment *this,string *filename)

{
  _Head_base<0UL,_inja::Environment::Impl_*,_false> _Var1;
  string_view local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Parser parser;
  
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
       .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl;
  parser.m_config = &(_Var1._M_head_impl)->parser_config;
  parser.m_lexer.m_config = &(_Var1._M_head_impl)->lexer_config;
  parser.m_included_templates = &(_Var1._M_head_impl)->included_templates;
  parser.m_lexer.m_in.data_ = (const_pointer)0x0;
  parser.m_lexer.m_in.size_ = 0;
  parser.m_tok.kind = Unknown;
  parser.m_tok.text.data_ = (const_pointer)0x0;
  parser.m_tok.text.size_ = 0;
  parser.m_peek_tok.text.data_ = (const_pointer)0x0;
  parser.m_peek_tok.text.size_ = 0;
  parser.m_have_peek_tok = false;
  parser.m_peek_tok.kind = parser.m_tok.kind;
  parser.m_static = ParserStatic::get_instance();
  parser.m_if_stack.super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser.m_if_stack.super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.m_if_stack.super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
       .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_e8,(string *)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 &(_Var1._M_head_impl)->input_path,&local_e8);
  Parser::parse_template(__return_storage_ptr__,&parser,local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  Parser::~Parser(&parser);
  return __return_storage_ptr__;
}

Assistant:

Template parse_template(const std::string& filename) {
		Parser parser(m_impl->parser_config, m_impl->lexer_config, m_impl->included_templates);
		return parser.parse_template(m_impl->input_path + static_cast<std::string>(filename));
	}